

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceGetEccState(zes_device_handle_t hDevice,zes_device_ecc_properties_t *pState)

{
  zes_pfnDeviceGetEccState_t pfnGetEccState;
  ze_result_t result;
  zes_device_ecc_properties_t *pState_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetEccState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ca98 != (code *)0x0) {
    pfnGetEccState._4_4_ = (*DAT_0011ca98)(hDevice,pState);
  }
  return pfnGetEccState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetEccState(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetEccState = context.zesDdiTable.Device.pfnGetEccState;
        if( nullptr != pfnGetEccState )
        {
            result = pfnGetEccState( hDevice, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }